

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O3

Token __thiscall flow::lang::Lexer::parseIdent(Lexer *this)

{
  string *psVar1;
  ulong uVar2;
  char *__s2;
  int iVar3;
  int iVar4;
  Token TVar5;
  char *__s1;
  anon_struct_16_2_6b51f6ec *paVar6;
  bool bVar7;
  
  psVar1 = &this->stringValue_;
  (this->stringValue_)._M_string_length = 0;
  *(this->stringValue_)._M_dataplus._M_p = '\0';
  std::__cxx11::string::push_back((char)psVar1);
  iVar3 = isxdigit(this->currentChar_);
  bVar7 = iVar3 != 0;
  while( true ) {
    nextChar(this,true);
    iVar3 = this->currentChar_;
    iVar4 = isalnum(iVar3);
    if (((iVar4 == 0) && (iVar3 != 0x5f)) && (iVar3 != 0x2e)) break;
    std::__cxx11::string::push_back((char)psVar1);
    iVar3 = isxdigit(this->currentChar_);
    if (iVar3 == 0) {
      bVar7 = false;
    }
  }
  if ((iVar3 != 0x3a) || (bVar7)) {
    uVar2 = (this->stringValue_)._M_string_length;
    if (uVar2 < 5) {
      if ((iVar3 == 0x3a) && (bVar7)) {
        bVar7 = true;
LAB_00133be2:
        TVar5 = continueParseIPv6(this,bVar7);
        return TVar5;
      }
      if (((uVar2 != 4) && (bVar7)) && (iVar3 = isxdigit(iVar3), iVar3 != 0)) {
        bVar7 = false;
        goto LAB_00133be2;
      }
    }
    __s2 = (psVar1->_M_dataplus)._M_p;
    __s1 = "in";
    paVar6 = parseIdent::keywords;
    do {
      paVar6 = paVar6 + 1;
      iVar3 = strcmp(__s1,__s2);
      if (iVar3 == 0) {
        TVar5 = paVar6[-1].token;
        this->token_ = TVar5;
        return TVar5;
      }
      __s1 = paVar6->symbol;
    } while (__s1 != (char *)0x0);
    iVar3 = std::__cxx11::string::compare((char *)psVar1);
    if ((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)psVar1), iVar3 == 0)) {
      this->numberValue_ = 1;
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)psVar1);
      if ((iVar3 != 0) && (iVar3 = std::__cxx11::string::compare((char *)psVar1), iVar3 != 0)) {
        this->token_ = Ident;
        return Ident;
      }
      this->numberValue_ = 0;
    }
    this->token_ = Boolean;
    TVar5 = Boolean;
  }
  else {
    nextChar(this,true);
    TVar5 = NamedParam;
  }
  return TVar5;
}

Assistant:

Token Lexer::parseIdent() {
  stringValue_.clear();
  stringValue_ += static_cast<char>(currentChar());
  bool isHex = isHexChar();

  nextChar();

  while (std::isalnum(currentChar()) || currentChar() == '_' ||
         currentChar() == '.') {
    stringValue_ += static_cast<char>(currentChar());
    if (!isHexChar()) isHex = false;

    nextChar();
  }

  if (currentChar() == ':' && !isHex) {
    nextChar();  // skip ':'
    return Token::NamedParam;
  }

  // ipv6HexDigit4 *(':' ipv6HexDigit4) ['::' [ipv6HexSeq]]
  if (stringValue_.size() <= 4 && isHex && currentChar() == ':')
    return continueParseIPv6(true);

  if (stringValue_.size() < 4 && isHex && isHexChar())
    return continueParseIPv6(false);

  static struct {
    const char* symbol;
    Token token;
  } keywords[] = {{"in", Token::In},
                  {"var", Token::Var},
                  {"match", Token::Match},
                  {"on", Token::On},
                  {"for", Token::For},
                  {"do", Token::Do},
                  {"if", Token::If},
                  {"then", Token::Then},
                  {"else", Token::Else},
                  {"while", Token::While},
                  {"unless", Token::Unless},
                  {"import", Token::Import},
                  {"from", Token::From},
                  {"handler", Token::Handler},
                  {"and", Token::And},
                  {"or", Token::Or},
                  {"xor", Token::Xor},
                  {"not", Token::Not},
                  {"shl", Token::Shl},
                  {"shr", Token::Shr},
                  {"bool", Token::BoolType},
                  {"int", Token::NumberType},
                  {"string", Token::StringType},
                  {nullptr, Token::Unknown}};

  for (auto i = keywords; i->symbol; ++i)
    if (strcmp(i->symbol, stringValue_.c_str()) == 0) return token_ = i->token;

  if (stringValue_ == "true" || stringValue_ == "yes") {
    numberValue_ = 1;
    return token_ = Token::Boolean;
  }

  if (stringValue_ == "false" || stringValue_ == "no") {
    numberValue_ = 0;
    return token_ = Token::Boolean;
  }

  return token_ = Token::Ident;
}